

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

unique_ptr<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>_> __thiscall
flow::lang::Parser::resolve
          (Parser *this,
          list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *callables,
          ParamList *params)

{
  CallableSym *pCVar1;
  _List_node_base *p_Var2;
  long *******ppppppplVar3;
  long *******ppppppplVar4;
  list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *plVar5;
  bool bVar6;
  CallExpr *pCVar7;
  _List_node_base *p_Var8;
  _Node *p_Var9;
  size_t *psVar10;
  Signature *pSVar11;
  ParamList *in_RCX;
  ParamList *pPVar12;
  const_iterator __end2;
  string msg;
  CallableSym *callee;
  Signature inputSignature;
  string local_158;
  CallExpr *local_138;
  list<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_> *local_130;
  CallableSym *local_128;
  long *******local_120;
  long *******local_118;
  size_t local_110;
  _List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  Signature local_f0;
  Signature local_b0;
  Signature local_70;
  
  local_130 = callables;
  makeSignature(&local_70,*(CallableSym **)(*(long *)params + 0x10),in_RCX);
  local_138 = *(CallExpr **)&(this->features_)._M_t._M_impl;
  for (pPVar12 = *(ParamList **)params; pPVar12 != params; pPVar12 = *(ParamList **)pPVar12) {
    pCVar1 = (CallableSym *)
             (pPVar12->names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = CallableSym::isDirectMatch(pCVar1,in_RCX);
    pCVar7 = local_138;
    if (bVar6) {
      pCVar7 = (CallExpr *)operator_new(0x80);
      CallExpr::CallExpr(pCVar7,&(pCVar1->super_Symbol).super_ASTNode.location_,pCVar1,in_RCX);
      if (bVar6) {
        *(CallExpr **)&(this->features_)._M_t._M_impl = pCVar7;
        goto LAB_001299db;
      }
    }
    local_138 = pCVar7;
  }
  *(CallExpr **)&(this->features_)._M_t._M_impl = local_138;
  local_120 = (long *******)&local_120;
  local_110 = 0;
  local_108._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_108;
  local_108._M_impl._M_node._M_size = 0;
  pPVar12 = *(ParamList **)params;
  local_118 = local_120;
  local_108._M_impl._M_node.super__List_node_base._M_prev =
       local_108._M_impl._M_node.super__List_node_base._M_next;
  if (pPVar12 != params) {
    do {
      local_128 = (CallableSym *)
                  (pPVar12->names_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      bVar6 = CallableSym::tryMatch(local_128,in_RCX,&local_158);
      if (bVar6) {
        p_Var8 = (_List_node_base *)operator_new(0x18);
        p_Var8[1]._M_next = (_List_node_base *)local_128;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar10 = &local_110;
      }
      else {
        p_Var9 = std::__cxx11::
                 list<std::pair<flow::lang::CallableSym*,std::__cxx11::string>,std::allocator<std::pair<flow::lang::CallableSym*,std::__cxx11::string>>>
                 ::_M_create_node<flow::lang::CallableSym*&,std::__cxx11::string&>
                           ((list<std::pair<flow::lang::CallableSym*,std::__cxx11::string>,std::allocator<std::pair<flow::lang::CallableSym*,std::__cxx11::string>>>
                             *)&local_108,&local_128,&local_158);
        std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
        psVar10 = &local_108._M_impl._M_node._M_size;
      }
      *psVar10 = *psVar10 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      pPVar12 = *(ParamList **)pPVar12;
    } while (pPVar12 != params);
  }
  plVar5 = local_130;
  if ((long ********)local_120 == &local_120) {
    p_Var8 = local_130[2].
             super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    p_Var2 = local_130[4].
             super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"No matching signature for {}.","");
    Signature::Signature(&local_b0,&local_70);
    diagnostics::Report::typeError<flow::Signature>
              ((Report *)p_Var2,(SourceLocation *)(p_Var8 + 3),&local_158,&local_b0);
    if (local_b0.args_.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.args_.
                      super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.args_.
                            super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.args_.
                            super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.name_._M_dataplus._M_p != &local_b0.name_.field_2) {
      operator_delete(local_b0.name_._M_dataplus._M_p,
                      local_b0.name_.field_2._M_allocated_capacity + 1);
    }
    p_Var8 = (_List_node_base *)&local_108;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
    while (p_Var8 = (((_List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)p_Var8)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var8 != (_List_node_base *)&local_108) {
      diagnostics::Report::typeError<>
                ((Report *)
                 plVar5[4].
                 super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                 ._M_impl._M_node.super__List_node_base._M_prev,
                 (SourceLocation *)
                 (plVar5[2].
                  super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next + 3),(string *)&p_Var8[1]._M_prev);
    }
  }
  else {
    if (local_110 < 2) {
      pCVar1 = (CallableSym *)local_120[2];
      if ((pCVar1->nativeCallback_->attributes_ & 1) != 0) {
        p_Var8 = local_130[2].
                 super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        p_Var2 = local_130[4].
                 super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"Using experimental builtin API {}.","");
        pSVar11 = NativeCallback::signature(pCVar1->nativeCallback_);
        Signature::Signature(&local_f0,pSVar11);
        diagnostics::Report::warning<flow::Signature>
                  ((Report *)p_Var2,(SourceLocation *)(p_Var8 + 3),&local_158,&local_f0);
        if (local_f0.args_.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_f0.args_.
                          super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_f0.args_.
                                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f0.args_.
                                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.name_._M_dataplus._M_p != &local_f0.name_.field_2) {
          operator_delete(local_f0.name_._M_dataplus._M_p,
                          local_f0.name_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                   local_158.field_2._M_local_buf[0]) + 1);
        }
      }
      pCVar7 = (CallExpr *)operator_new(0x80);
      CallExpr::CallExpr(pCVar7,&(pCVar1->super_Symbol).super_ASTNode.location_,pCVar1,in_RCX);
      goto LAB_001299a5;
    }
    p_Var8 = local_130[2].
             super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    p_Var2 = local_130[4].
             super__List_base<flow::lang::CallableSym_*,_std::allocator<flow::lang::CallableSym_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Call to builtin is ambiguous.","");
    diagnostics::Report::typeError<>((Report *)p_Var2,(SourceLocation *)(p_Var8 + 3),&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
  }
  *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  pCVar7 = (CallExpr *)0x0;
LAB_001299a5:
  *(CallExpr **)&(this->features_)._M_t._M_impl = pCVar7;
  std::__cxx11::
  _List_base<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<flow::lang::CallableSym_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear(&local_108);
  ppppppplVar4 = local_120;
  while ((long ********)ppppppplVar4 != &local_120) {
    ppppppplVar3 = (long *******)*ppppppplVar4;
    operator_delete(ppppppplVar4,0x18);
    ppppppplVar4 = ppppppplVar3;
  }
LAB_001299db:
  if (local_70.args_.super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.args_.
                    super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.args_.
                          super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.args_.
                          super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name_._M_dataplus._M_p != &local_70.name_.field_2) {
    operator_delete(local_70.name_._M_dataplus._M_p,local_70.name_.field_2._M_allocated_capacity + 1
                   );
  }
  return (__uniq_ptr_data<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>,_true,_true>
          )(__uniq_ptr_data<flow::lang::CallExpr,_std::default_delete<flow::lang::CallExpr>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CallExpr> Parser::resolve(
    const std::list<CallableSym*>& callables, ParamList&& params) {
  Signature inputSignature = makeSignature(callables.front(), params);

  // attempt to find a full match first
  for (CallableSym* callee : callables) {
    if (callee->isDirectMatch(params)) {
      return std::make_unique<CallExpr>(callee->location(), callee,
                                        std::move(params));
    }
  }

  // attempt to find something with default values or parameter-reordering (if
  // named args)
  std::list<CallableSym*> result;
  std::list<std::pair<CallableSym*, std::string>> matchErrors;

  for (CallableSym* callee : callables) {
    std::string msg;
    if (callee->tryMatch(params, &msg)) {
      result.push_back(callee);
    } else {
      matchErrors.emplace_back(callee, msg);
    }
  }

  if (result.empty()) {
    report_.typeError(lastLocation(), "No matching signature for {}.", inputSignature);
    for (const auto& me : matchErrors) {
      report_.typeError(lastLocation(), me.second);
    }
    return nullptr;
  }

  if (result.size() > 1) {
    report_.typeError(lastLocation(), "Call to builtin is ambiguous.");
    return nullptr;
  }

  CallableSym* callableSym = result.front();

  if (callableSym->nativeCallback()->isExperimental()) {
    report_.warning(lastLocation(),
                    "Using experimental builtin API {}.",
                    callableSym->nativeCallback()->signature());
  }

  return std::make_unique<CallExpr>(callableSym->location(), callableSym,
                                    std::move(params));
}